

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

easm_sinsn * dis_parse_sinsn(disctx *ctx,dis_status *status,int *spos)

{
  int iVar1;
  litem **pplVar2;
  easm_sinsn *peVar3;
  undefined8 *puVar4;
  char *pcVar5;
  easm_operand *peVar6;
  easm_expr **ppeVar7;
  easm_expr *peVar8;
  easm_operand **ppeVar9;
  bool bVar10;
  easm_operand *op;
  easm_mod *mod;
  easm_mods *mods;
  easm_sinsn *res;
  int *spos_local;
  dis_status *status_local;
  disctx *ctx_local;
  
  peVar3 = (easm_sinsn *)calloc(0x40,1);
  peVar3->str = ctx->atoms[*spos]->str;
  peVar3->isunk = ctx->atoms[*spos]->isunk;
  if (peVar3->isunk != 0) {
    *status = *status | DIS_STATUS_UNK_INSN;
  }
  pplVar2 = ctx->atoms;
  iVar1 = *spos;
  *spos = iVar1 + 1;
  if (pplVar2[iVar1]->type == LITEM_NAME) {
    mod = (easm_mod *)calloc(0x28,1);
    while( true ) {
      bVar10 = false;
      if (*spos < ctx->atomsnum) {
        bVar10 = ctx->atoms[*spos]->type != LITEM_SEEND;
      }
      if (!bVar10) break;
      if (ctx->atoms[*spos]->type == LITEM_NAME) {
        puVar4 = (undefined8 *)calloc(0x28,1);
        *puVar4 = ctx->atoms[*spos]->str;
        *(int *)(puVar4 + 1) = ctx->atoms[*spos]->isunk;
        if (*(int *)(puVar4 + 1) != 0) {
          *status = *status | DIS_STATUS_UNK_OPERAND;
        }
        if (*(int *)&mod->field_0xc <= mod->isunk) {
          if (*(int *)&mod->field_0xc == 0) {
            *(undefined4 *)&mod->field_0xc = 0x10;
          }
          else {
            *(int *)&mod->field_0xc = *(int *)&mod->field_0xc << 1;
          }
          pcVar5 = (char *)realloc(mod->str,(long)*(int *)&mod->field_0xc << 3);
          mod->str = pcVar5;
        }
        iVar1 = mod->isunk;
        mod->isunk = iVar1 + 1;
        *(undefined8 **)(mod->str + (long)iVar1 * 8) = puVar4;
        *spos = *spos + 1;
      }
      else {
        peVar6 = (easm_operand *)calloc(0x30,1);
        peVar6->mods = (easm_mods *)mod;
        mod = (easm_mod *)calloc(0x28,1);
        if (peVar6->exprsmax <= peVar6->exprsnum) {
          if (peVar6->exprsmax == 0) {
            peVar6->exprsmax = 0x10;
          }
          else {
            peVar6->exprsmax = peVar6->exprsmax << 1;
          }
          ppeVar7 = (easm_expr **)realloc(peVar6->exprs,(long)peVar6->exprsmax << 3);
          peVar6->exprs = ppeVar7;
        }
        peVar8 = dis_parse_expr(ctx,status,spos);
        iVar1 = peVar6->exprsnum;
        peVar6->exprsnum = iVar1 + 1;
        peVar6->exprs[iVar1] = peVar8;
        if (peVar3->operandsmax <= peVar3->operandsnum) {
          if (peVar3->operandsmax == 0) {
            peVar3->operandsmax = 0x10;
          }
          else {
            peVar3->operandsmax = peVar3->operandsmax << 1;
          }
          ppeVar9 = (easm_operand **)realloc(peVar3->operands,(long)peVar3->operandsmax << 3);
          peVar3->operands = ppeVar9;
        }
        iVar1 = peVar3->operandsnum;
        peVar3->operandsnum = iVar1 + 1;
        peVar3->operands[iVar1] = peVar6;
      }
    }
    peVar3->mods = (easm_mods *)mod;
    return peVar3;
  }
  abort();
}

Assistant:

static struct easm_sinsn *dis_parse_sinsn(struct disctx *ctx, enum dis_status *status, int *spos) {
	struct easm_sinsn *res = calloc(sizeof *res, 1);
	res->str = ctx->atoms[*spos]->str;
	res->isunk = ctx->atoms[*spos]->isunk;
	if (res->isunk)
		*status |= DIS_STATUS_UNK_INSN;
	if (ctx->atoms[(*spos)++]->type != LITEM_NAME)
		abort();
	struct easm_mods *mods = calloc (sizeof *mods, 1);
	while (*spos < ctx->atomsnum && ctx->atoms[*spos]->type != LITEM_SEEND) {
		if (ctx->atoms[*spos]->type == LITEM_NAME) {
			struct easm_mod *mod = calloc(sizeof *mod, 1);
			mod->str = ctx->atoms[*spos]->str;
			mod->isunk = ctx->atoms[*spos]->isunk;
			if (mod->isunk)
				*status |= DIS_STATUS_UNK_OPERAND;
			ADDARRAY(mods->mods, mod);
			(*spos)++;
		} else {
			struct easm_operand *op = calloc (sizeof *op, 1);
			op->mods = mods;
			mods = calloc (sizeof *mods, 1);
			ADDARRAY(op->exprs, dis_parse_expr(ctx, status, spos));
			ADDARRAY(res->operands, op);
		}
	}
	res->mods = mods;
	return res;
}